

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BracketInsert_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BracketInsert_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  key_type file;
  value_type lhs_expression;
  value_type this_00;
  long in_RDI;
  Hasher HVar3;
  Hasher HVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TypeParam ht;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa64;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa68;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa70;
  char *in_stack_fffffffffffffa78;
  int iVar5;
  allocator_type *in_stack_fffffffffffffa80;
  key_equal *in_stack_fffffffffffffa88;
  Type type;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  key_type *in_stack_fffffffffffffa98;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  char *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  uint i;
  AssertionResult *in_stack_fffffffffffffad8;
  Message *message;
  AssertHelper *in_stack_fffffffffffffae0;
  AssertHelper *this_01;
  Hasher local_480;
  int local_470;
  undefined4 local_46c;
  AssertionResult local_468;
  value_type local_458;
  value_type local_450;
  key_type local_448 [3];
  Hasher local_430;
  Hasher local_420;
  int local_410;
  undefined4 local_40c;
  AssertionResult local_408;
  value_type local_3f8;
  value_type local_3f0;
  key_type local_3e8 [3];
  Hasher local_3d0;
  Hasher local_3c0;
  int local_3b0;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_398;
  AssertHelper local_388;
  Message local_37c;
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_370;
  string local_2e0 [52];
  value_type local_2ac;
  value_type local_2a4;
  key_type local_29c;
  undefined1 local_291;
  AssertionResult local_290;
  string local_280 [52];
  value_type local_24c;
  value_type local_244;
  key_type local_23c;
  undefined1 local_231;
  AssertionResult local_230;
  value_type local_220;
  value_type local_218;
  key_type local_210;
  string local_208 [52];
  value_type local_1d4;
  value_type local_1cc;
  key_type local_1c4;
  undefined1 local_1b9;
  AssertionResult local_1b8;
  string local_1a8 [48];
  iterator local_178;
  key_type local_158;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_150;
  undefined1 local_129;
  AssertionResult local_128;
  value_type local_118;
  value_type local_110;
  key_type local_108;
  string local_100 [48];
  iterator local_d0;
  key_type local_b0;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  undefined1 local_81;
  AssertionResult local_80;
  string local_70 [68];
  value_type local_2c;
  key_type local_24;
  undefined1 local_19;
  AssertionResult local_18;
  
  bVar1 = google::
          HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_brackets((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)(in_RDI + 0x10));
  if (bVar1) {
    local_24 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_2c = google::
               HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::default_data((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffa58);
    local_19 = google::
               HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
               ::bracket_equal<std::pair<int,int>>
                         ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                           *)(in_RDI + 0x10),&local_24,&local_2c);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (bool *)in_stack_fffffffffffffa58,(type *)0xe055a2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,
                 (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_70);
      testing::Message::~Message((Message *)0xe05663);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe056fa);
    local_b0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::end(in_stack_fffffffffffffaa0);
    local_81 = google::
               dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator!=(&local_a8,&local_d0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (bool *)in_stack_fffffffffffffa58,(type *)0xe05790);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_80);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,
                 (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_100);
      testing::Message::~Message((Message *)0xe05863);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe058fa);
    local_108 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_118 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_110 = google::
                HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_118);
    google::
    HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::bracket_assign<std::pair<int,int>>
              ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)(in_RDI + 0x10),&local_108,&local_110);
    local_158 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    google::
    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::end(in_stack_fffffffffffffaa0);
    local_129 = google::
                dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::operator!=(&local_150,&local_178);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (bool *)in_stack_fffffffffffffa58,(type *)0xe05a1c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,
                 (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_1a8);
      testing::Message::~Message((Message *)0xe05aef);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe05b86);
    local_1c4 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_1d4 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_1cc = google::
                HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_1d4);
    local_1b9 = google::
                HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                ::bracket_equal<std::pair<int,int>>
                          ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                            *)(in_RDI + 0x10),&local_1c4,&local_1cc);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (bool *)in_stack_fffffffffffffa58,(type *)0xe05c34);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,
                 (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_208);
      testing::Message::~Message((Message *)0xe05d07);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe05d9e);
    local_210 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_220 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_218 = google::
                HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_220);
    google::
    HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::bracket_assign<std::pair<int,int>>
              ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)(in_RDI + 0x10),&local_210,&local_218);
    local_23c = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_24c = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_244 = google::
                HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_24c);
    local_231 = google::
                HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                ::bracket_equal<std::pair<int,int>>
                          ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                            *)(in_RDI + 0x10),&local_23c,&local_244);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (bool *)in_stack_fffffffffffffa58,(type *)0xe05ed8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,
                 (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_280);
      testing::Message::~Message((Message *)0xe05fab);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe06042);
    local_29c = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_2ac = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_2a4 = google::
                HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)(in_RDI + 0x10),&local_2ac);
    local_291 = google::
                HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                ::bracket_equal<std::pair<int,int>>
                          ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                            *)(in_RDI + 0x10),&local_29c,&local_2a4);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (bool *)in_stack_fffffffffffffa58,(type *)0xe060f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,
                 (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8,
                 (char *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                 (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),(char *)in_stack_fffffffffffffa80,
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      std::__cxx11::string::~string(local_2e0);
      testing::Message::~Message((Message *)0xe061c3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0625a);
    message = &local_37c;
    i = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (int)((ulong)in_stack_fffffffffffffa58 >> 0x20));
    this_01 = &local_388;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
               (int)((ulong)in_stack_fffffffffffffa58 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_398,i,(int *)(ulong)i);
    google::
    HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
               (hasher *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
               in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    type = (Type)((ulong)in_stack_fffffffffffffa88 >> 0x20);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_398);
    local_3ac = 0;
    local_3d0 = (Hasher)google::
                        BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        ::hash_funct(in_stack_fffffffffffffa70);
    local_3c0 = local_3d0;
    local_3b0 = Hasher::num_hashes(&local_3c0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
               (int *)in_stack_fffffffffffffa68,
               (int *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
      testing::AssertionResult::failure_message((AssertionResult *)0xe06401);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),type,
                 (char *)in_stack_fffffffffffffa80,(int)((ulong)in_stack_fffffffffffffa78 >> 0x20),
                 (char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=(this_01,message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      testing::Message::~Message((Message *)0xe0645e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe064cf);
    local_3e8[0] = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_3f8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_3f0 = google::
                HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                ::get_data(&local_370,&local_3f8);
    google::
    HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::bracket_assign<std::pair<int,int>>
              ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_370,local_3e8,&local_3f0);
    local_40c = 1;
    HVar3 = (Hasher)google::
                    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::hash_funct(in_stack_fffffffffffffa70);
    local_430 = HVar3;
    local_420 = HVar3;
    local_410 = Hasher::num_hashes(&local_420);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
               (int *)in_stack_fffffffffffffa68,
               (int *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
    iVar5 = (int)((ulong)in_stack_fffffffffffffa78 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffffa90));
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xe06643);
      type = (Type)((ulong)pcVar2 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffffa90),type,
                 (char *)in_stack_fffffffffffffa80,iVar5,(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=(this_01,message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      testing::Message::~Message((Message *)0xe066a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe06711);
    file = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffffa68,in_stack_fffffffffffffa64);
    local_448[0] = file;
    lhs_expression =
         HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffa58,0);
    local_458 = lhs_expression;
    this_00 = google::
              HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::get_data(&local_370,&local_458);
    local_450 = this_00;
    google::
    HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::bracket_assign<std::pair<int,int>>
              ((HashtableInterface_DenseHashtable<std::pair<int,int>,std::pair<int,int>,kEmptyIntPair,TransparentHasher,PairNegation<std::pair<int,int>>,SetKey<std::pair<int,int>,PairNegation<std::pair<int,int>>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_370,local_448,&local_450);
    local_46c = 2;
    HVar4 = (Hasher)google::
                    BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ::hash_funct((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                  *)this_00);
    local_480 = HVar4;
    local_470 = Hasher::num_hashes(&local_480);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)lhs_expression,(char *)this_00,HVar4._0_8_,
               (int *)CONCAT44(HVar4.num_compares_,in_stack_fffffffffffffa60));
    iVar5 = lhs_expression.second;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_468);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffffa90));
      testing::AssertionResult::failure_message((AssertionResult *)0xe06885);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffffa90),type,
                 (char *)file,iVar5,(char *)this_00);
      testing::internal::AssertHelper::operator=(this_01,message);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(HVar4.num_compares_,in_stack_fffffffffffffa60));
      testing::Message::~Message((Message *)0xe068e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xe0694b);
    google::
    HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xe06958);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketInsert) {
  // tests operator[], for those types that support it.
  if (!this->ht_.supports_brackets()) return;

  // bracket_equal is equivalent to ht_[a] == b.  It should insert a if
  // it doesn't already exist.
  EXPECT_TRUE(
      this->ht_.bracket_equal(this->UniqueKey(1), this->ht_.default_data()));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());

  // bracket_assign is equivalent to ht_[a] = b.
  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(4)));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(2)) != this->ht_.end());
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(4))));

  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(6)));
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));
  // bracket_equal shouldn't have modified the value.
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));

  // Verify that an operator[] that doesn't cause a resize, also
  // doesn't require an extra rehash.
  TypeParam ht(100);
  EXPECT_EQ(0, ht.hash_funct().num_hashes());
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(1, ht.hash_funct().num_hashes());

  // And overwriting, likewise, should only cause one extra hash.
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(2, ht.hash_funct().num_hashes());
}